

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O0

CodeLocation __thiscall
soul::SourceCodeUtilities::findStartOfPrecedingComment
          (SourceCodeUtilities *this,CodeLocation *location)

{
  bool bVar1;
  int iVar2;
  SourceCodeText *pSVar3;
  UTF8Reader extraout_RDX;
  string_view sVar4;
  CodeLocation CVar5;
  byte local_23b;
  UTF8Reader local_210;
  UTF8Reader local_208;
  UTF8Reader local_200;
  UTF8Reader local_1f8;
  UTF8Reader local_1f0;
  string local_1e8;
  string local_1c8;
  byte local_1a1;
  UTF8Reader local_1a0;
  UTF8Reader fileStart;
  string local_188;
  string local_168;
  string_view local_148;
  string_view local_138;
  byte local_122;
  byte local_121;
  string local_120;
  string local_100;
  string_view local_e0;
  undefined1 local_d0 [8];
  CodeLocation next;
  string_view local_b8;
  string local_a8;
  string local_88;
  string_view local_68;
  undefined1 local_58 [8];
  string prevLine;
  undefined1 local_28 [8];
  CodeLocation prevLineStart;
  CodeLocation *location_local;
  CodeLocation *start;
  
  prevLineStart.location.data = (char *)location;
  CodeLocation::getStartOfPreviousLine((CodeLocation *)local_28);
  bVar1 = CodeLocation::isEmpty((CodeLocation *)local_28);
  if (bVar1) {
    CodeLocation::CodeLocation((CodeLocation *)this,location);
    prevLine.field_2._8_4_ = 1;
    goto LAB_00324431;
  }
  CodeLocation::getSourceLine_abi_cxx11_((string *)local_58,(CodeLocation *)local_28);
  std::__cxx11::string::string((string *)&local_a8,(string *)local_58);
  choc::text::trimStart(&local_88,&local_a8);
  local_68 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_88);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8,"//");
  bVar1 = choc::text::startsWith(local_68,local_b8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  if (bVar1) {
    next.location.data._7_1_ = 0;
    CodeLocation::CodeLocation((CodeLocation *)this,(CodeLocation *)local_28);
    do {
      CodeLocation::getStartOfPreviousLine((CodeLocation *)local_d0);
      local_121 = 0;
      local_122 = 0;
      bVar1 = CodeLocation::isEmpty((CodeLocation *)local_d0);
      local_23b = 1;
      if (!bVar1) {
        CodeLocation::getSourceLine_abi_cxx11_(&local_120,(CodeLocation *)local_d0);
        local_121 = 1;
        choc::text::trimStart(&local_100,&local_120);
        local_122 = 1;
        sVar4 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_100);
        local_e0 = sVar4;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_138,"//");
        bVar1 = choc::text::startsWith(local_e0,local_138);
        local_23b = bVar1 ^ 0xff;
      }
      if ((local_122 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_100);
      }
      if ((local_121 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_120);
      }
      bVar1 = (local_23b & 1) != 0;
      if (bVar1) {
        next.location.data._7_1_ = 1;
      }
      else {
        CodeLocation::operator=((CodeLocation *)this,(CodeLocation *)local_d0);
      }
      prevLine.field_2._9_3_ = 0;
      prevLine.field_2._M_local_buf[8] = bVar1;
      CodeLocation::~CodeLocation((CodeLocation *)local_d0);
    } while (prevLine.field_2._8_4_ == 0);
    if ((next.location.data._7_1_ & 1) == 0) {
      CodeLocation::~CodeLocation((CodeLocation *)this);
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_188,(string *)local_58);
    choc::text::trimEnd(&local_168,&local_188);
    local_148 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_168);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&fileStart,"*/");
    bVar1 = choc::text::endsWith(local_148,_fileStart);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    if (bVar1) {
      pSVar3 = RefCountedPtr<soul::SourceCodeText>::operator->
                         ((RefCountedPtr<soul::SourceCodeText> *)local_28);
      UTF8Reader::UTF8Reader(&local_1a0,&pSVar3->utf8);
      local_1a1 = 0;
      CodeLocation::CodeLocation((CodeLocation *)this,(CodeLocation *)local_28);
      std::__cxx11::string::string((string *)&local_1e8,(string *)local_58);
      choc::text::trimEnd(&local_1c8,&local_1e8);
      iVar2 = std::__cxx11::string::length();
      UTF8Reader::operator+=((UTF8Reader *)(this + 8),iVar2 + -2);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1e8);
      UTF8Reader::operator+(&local_1f0,(int)&local_1a0);
      bVar1 = UTF8Reader::operator>((UTF8Reader *)(this + 8),&local_1f0);
      if (bVar1) {
        UTF8Reader::operator--(&local_1f8);
        UTF8Reader::operator--(&local_200);
        while( true ) {
          bVar1 = UTF8Reader::startsWith((UTF8Reader *)(this + 8),"/*");
          if (bVar1) break;
          UTF8Reader::UTF8Reader(&local_208,&local_1a0);
          bVar1 = UTF8Reader::operator>((UTF8Reader *)(this + 8),&local_208);
          if (!bVar1) goto LAB_003243ca;
          UTF8Reader::operator--(&local_210);
        }
        local_1a1 = 1;
        prevLine.field_2._8_4_ = 1;
      }
      else {
LAB_003243ca:
        prevLine.field_2._8_4_ = 0;
      }
      if ((local_1a1 & 1) == 0) {
        CodeLocation::~CodeLocation((CodeLocation *)this);
      }
      if (prevLine.field_2._8_4_ != 0) goto LAB_0032441b;
    }
    CodeLocation::CodeLocation((CodeLocation *)this,location);
    prevLine.field_2._8_4_ = 1;
  }
LAB_0032441b:
  std::__cxx11::string::~string((string *)local_58);
LAB_00324431:
  CodeLocation::~CodeLocation((CodeLocation *)local_28);
  CVar5.location.data = extraout_RDX.data;
  CVar5.sourceCode.object = (SourceCodeText *)this;
  return CVar5;
}

Assistant:

CodeLocation SourceCodeUtilities::findStartOfPrecedingComment (CodeLocation location)
{
    auto prevLineStart = location.getStartOfPreviousLine();

    if (prevLineStart.isEmpty())
        return location;

    auto prevLine = prevLineStart.getSourceLine();

    if (choc::text::startsWith (choc::text::trimStart (prevLine), "//"))
    {
        for (auto start = prevLineStart;;)
        {
            auto next = start.getStartOfPreviousLine();

            if (next.isEmpty() || ! choc::text::startsWith (choc::text::trimStart (next.getSourceLine()), "//"))
                return start;

            start = next;
        }
    }

    if (choc::text::endsWith (choc::text::trimEnd (prevLine), "*/"))
    {
        auto fileStart = prevLineStart.sourceCode->utf8;
        auto start = prevLineStart;
        start.location += static_cast<int> (choc::text::trimEnd (prevLine).length() - 2);

        if (start.location > fileStart + 1)
        {
            --(start.location);
            --(start.location);

            for (;;)
            {
                if (start.location.startsWith ("/*"))
                    return start;

                if (start.location > fileStart)
                    --(start.location);
                else
                    break;
            }
        }
    }

    return location;
}